

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

VariableP<tcu::Matrix<float,_4,_3>_> __thiscall
vkt::shaderexecutor::variable<tcu::Matrix<float,4,3>>(shaderexecutor *this,string *name)

{
  Variable<tcu::Matrix<float,_4,_3>_> *this_00;
  SharedPtrStateBase *extraout_RDX;
  VariableP<tcu::Matrix<float,_4,_3>_> VVar1;
  string *name_local;
  
  this_00 = (Variable<tcu::Matrix<float,_4,_3>_> *)operator_new(0x28);
  Variable<tcu::Matrix<float,_4,_3>_>::Variable(this_00,name);
  VariableP<tcu::Matrix<float,_4,_3>_>::VariableP
            ((VariableP<tcu::Matrix<float,_4,_3>_> *)this,this_00);
  VVar1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_state =
       extraout_RDX;
  VVar1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr =
       (Variable<tcu::Matrix<float,_4,_3>_> *)this;
  return (VariableP<tcu::Matrix<float,_4,_3>_>)
         VVar1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>;
}

Assistant:

VariableP<T> variable (const string& name)
{
	return VariableP<T>(new Variable<T>(name));
}